

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

void __thiscall
slang::ast::Expression::visit<(anonymous_namespace)::HierarchicalVisitor&>
          (Expression *this,HierarchicalVisitor *visitor)

{
  undefined8 *puVar1;
  __index_type _Var2;
  not_null<const_slang::ast::Type_*> nVar3;
  Symbol *pSVar4;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar5;
  variant_alternative_t<1UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar6;
  SyntaxNode *pSVar7;
  DeclaredType *this_00;
  Expression *pEVar8;
  variant_alternative_t<2UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar9;
  logic_error *plVar10;
  long *plVar11;
  size_type *psVar12;
  long *plVar13;
  HierarchicalVisitor *visitor_00;
  long lVar14;
  long lVar15;
  long lVar16;
  StreamExpression *stream;
  SyntaxNode *pSVar17;
  SyntaxNode *pSVar18;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  visitor_00 = visitor;
LAB_00261ae2:
  lVar14 = 0x38;
  switch((((Type *)this)->super_Symbol).kind) {
  case Unknown:
  case Root:
  case CompilationUnit:
  case DeferredMember:
  case TransparentMember:
  case EmptyMember:
  case PredefinedIntegerType:
  case ScalarType:
  case FloatingType:
  case ClassType:
  case NullType:
  case CHandleType:
  case StringType:
  case EventType:
  case SequenceType:
    goto switchD_00261afc_caseD_0;
  case EnumType:
    visitor->any = true;
    return;
  case EnumValue:
  case VoidType:
    break;
  case PackedArrayType:
    goto switchD_00261afc_caseD_b;
  case FixedSizeUnpackedArrayType:
    nVar3.ptr = (((Expression *)((long)&((Type *)this)->super_Symbol + 0x30))->type).ptr;
    if (nVar3.ptr != (Type *)0x0) {
      lVar14 = *(long *)((long)&((Type *)this)->super_Symbol + 0x30);
      lVar15 = 0;
      do {
        pEVar8 = *(Expression **)(lVar14 + lVar15);
        if (pEVar8 == (Expression *)0x0) goto LAB_00261f0e;
        visit<(anonymous_namespace)::HierarchicalVisitor&>(pEVar8,visitor);
        lVar15 = lVar15 + 0x10;
      } while ((long)nVar3.ptr << 4 != lVar15);
    }
  case AssociativeArrayType:
    visitor_00 = visitor;
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              ((Expression *)((Type *)this)->canonical,visitor);
    lVar14 = 0x48;
    break;
  case DynamicArrayType:
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              (*(Expression **)((long)&((Type *)this)->super_Symbol + 0x30),visitor);
    lVar14 = (long)((Type *)this)->canonical;
    if (lVar14 == 0) {
      return;
    }
    pSVar18 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
    lVar15 = 0;
    do {
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                (*(Expression **)((long)&pSVar18->parent + lVar15),visitor);
      lVar15 = lVar15 + 8;
    } while (lVar14 << 3 != lVar15);
    return;
  case QueueType:
    pSVar18 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
    if (pSVar18 == (SyntaxNode *)0x0) {
      return;
    }
    lVar14 = *(long *)((long)&((Type *)this)->super_Symbol + 0x30);
    lVar15 = 0;
    do {
      visit<(anonymous_namespace)::HierarchicalVisitor&>(*(Expression **)(lVar14 + lVar15),visitor);
      lVar15 = lVar15 + 8;
    } while ((long)pSVar18 << 3 != lVar15);
    return;
  case PackedStructType:
  case PackedUnionType:
  case PropertyType:
    visitor_00 = visitor;
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              (*(Expression **)((long)&((Type *)this)->super_Symbol + 0x30),visitor);
    break;
  case UnpackedStructType:
    if (((Type *)this)->canonical == (Type *)0x0) {
      return;
    }
    pSVar18 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
    puVar1 = (undefined8 *)((long)pSVar18 + (long)((Type *)this)->canonical * 0x18);
    while ((Expression *)pSVar18->parent != (Expression *)0x0) {
      visit<(anonymous_namespace)::HierarchicalVisitor&>((Expression *)pSVar18->parent,visitor);
      if (*(Expression **)&pSVar18->kind != (Expression *)0x0) {
        visit<(anonymous_namespace)::HierarchicalVisitor&>(*(Expression **)&pSVar18->kind,visitor);
      }
      pSVar18 = (SyntaxNode *)((long)(pSVar18 + 1) + 8);
      if (pSVar18 == (SyntaxNode *)puVar1) {
        return;
      }
    }
LAB_00261f0e:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<const slang::ast::Expression *>::get() const [T = const slang::ast::Expression *]"
              );
  case UnpackedUnionType:
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              (*(Expression **)((long)&((Type *)this)->super_Symbol + 0x30),visitor);
    goto switchD_00261afc_caseD_b;
  case CovergroupType:
    if (*(Scope **)((long)this + 0x48U + 0x20) != (Scope *)0x0) {
      visitor_00 = visitor;
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                ((Expression *)*(Scope **)((long)this + 0x48U + 0x20),visitor);
    }
    if (*(char *)((long)this + 0x48U + 0x18) == '\x01') {
      pvVar5 = std::
               get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                         ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                           *)((long)&((Type *)this)->super_Symbol + 0x30));
      _Var2 = *(__index_type *)
               ((long)&(pvVar5->extraInfo).
                       super__Variant_base<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                       .
                       super__Move_assign_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                       .
                       super__Copy_assign_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                       .
                       super__Move_ctor_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                       .
                       super__Copy_ctor_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                       .
                       super__Variant_storage_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
               + 0x18);
      if (_Var2 == '\x02') {
        pvVar9 = std::
                 get<2ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                           (&pvVar5->extraInfo);
        if (pvVar9->inlineConstraints != (Constraint *)0x0) {
          Constraint::visit<(anonymous_namespace)::HierarchicalVisitor>
                    ((Constraint *)(ulong)pvVar9->inlineConstraints->kind,visitor_00);
        }
      }
      else if (_Var2 == '\x01') {
        pvVar6 = std::
                 get<1ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                           (&pvVar5->extraInfo);
        if (pvVar6->iterExpr != (Expression *)0x0) {
          visit<(anonymous_namespace)::HierarchicalVisitor&>(pvVar6->iterExpr,visitor);
        }
      }
    }
    lVar14 = *(long *)((long)this + 0x48U + 0x30);
    if (lVar14 == 0) {
      return;
    }
    pSVar4 = *(Symbol **)((long)this + 0x48U + 0x28);
    lVar15 = 0;
    do {
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                (*(Expression **)((long)&pSVar4->kind + lVar15),visitor);
      lVar15 = lVar15 + 8;
    } while (lVar14 << 3 != lVar15);
    return;
  case UnboundedType:
    pSVar18 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
    if (pSVar18 == (SyntaxNode *)0x0) {
      return;
    }
    lVar14 = *(long *)((long)&((Type *)this)->super_Symbol + 0x30);
    lVar15 = 0;
    do {
      visit<(anonymous_namespace)::HierarchicalVisitor&>(*(Expression **)(lVar14 + lVar15),visitor);
      lVar15 = lVar15 + 8;
    } while ((long)pSVar18 << 3 != lVar15);
    return;
  case TypeRefType:
    pSVar18 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
    if (pSVar18 == (SyntaxNode *)0x0) {
      return;
    }
    lVar14 = *(long *)((long)&((Type *)this)->super_Symbol + 0x30);
    lVar15 = 0;
    do {
      visit<(anonymous_namespace)::HierarchicalVisitor&>(*(Expression **)(lVar14 + lVar15),visitor);
      lVar15 = lVar15 + 8;
    } while ((long)pSVar18 << 3 != lVar15);
    return;
  case UntypedType:
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              ((Expression *)((Type *)this)->canonical,visitor);
    pSVar18 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
    if (pSVar18 == (SyntaxNode *)0x0) {
      return;
    }
    lVar14 = *(long *)((long)&((Type *)this)->super_Symbol + 0x30);
    lVar15 = 0;
    do {
      visit<(anonymous_namespace)::HierarchicalVisitor&>(*(Expression **)(lVar14 + lVar15),visitor);
      lVar15 = lVar15 + 8;
    } while ((long)pSVar18 << 3 != lVar15);
    return;
  case VirtualInterfaceType:
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              (*(Expression **)((long)&((Type *)this)->super_Symbol + 0x30),visitor);
    lVar14 = (long)((Type *)this)->canonical;
    if (lVar14 == 0) {
      return;
    }
    pSVar18 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
    pSVar17 = pSVar18 + 1;
    do {
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                ((Expression *)pSVar17[0xffffffffffffffff].parent,visitor);
      if ((char)pSVar17->kind == SyntaxList) {
        visit<(anonymous_namespace)::HierarchicalVisitor&>((Expression *)pSVar17->parent,visitor);
      }
      pSVar7 = pSVar17 + 1;
      pSVar17 = pSVar17 + 2;
    } while (pSVar7 != pSVar18 + lVar14 * 2);
    return;
  case TypeAlias:
    visitor_00 = visitor;
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              (*(Expression **)((long)&((Type *)this)->super_Symbol + 0x30),visitor);
  case ErrorType:
  case MultiPort:
    goto switchD_00261afc_caseD_22;
  case ForwardingTypedef:
    pSVar18 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
    if (pSVar18 == (SyntaxNode *)0x0) {
      return;
    }
    lVar14 = *(long *)((long)&((Type *)this)->super_Symbol + 0x30);
    lVar15 = 0;
    do {
      visit<(anonymous_namespace)::HierarchicalVisitor&>(*(Expression **)(lVar14 + lVar15),visitor);
      lVar15 = lVar15 + 8;
    } while ((long)pSVar18 << 3 != lVar15);
    return;
  case NetType:
  case Parameter:
    lVar14 = 0x30;
    break;
  case TypeParameter:
    if (**(uint **)((long)&((Type *)this)->super_Symbol + 0x30) < 10) {
      return;
    }
    plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,"");
    plVar11 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar11;
    psVar12 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar12) {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0.field_2._8_8_ = plVar11[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar12;
    }
    local_b0._M_string_length = plVar11[1];
    *plVar11 = (long)psVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x123);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar11;
    plVar13 = plVar11 + 2;
    if (local_90 == plVar13) {
      local_80 = *plVar13;
      lStack_78 = plVar11[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar13;
    }
    local_88 = plVar11[1];
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar11;
    plVar13 = plVar11 + 2;
    if (local_f0 == plVar13) {
      local_e0 = *plVar13;
      lStack_d8 = plVar11[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar13;
    }
    local_e8 = plVar11[1];
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::logic_error::logic_error(plVar10,(string *)&local_f0);
    __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case Port:
    if (0xc < *(uint *)&(*(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38))->parent) {
      plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
                 ,"");
      plVar11 = (long *)std::__cxx11::string::append((char *)local_d0);
      local_b0._M_dataplus._M_p = (pointer)*plVar11;
      psVar12 = (size_type *)(plVar11 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar12) {
        local_b0.field_2._M_allocated_capacity = *psVar12;
        local_b0.field_2._8_8_ = plVar11[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar12;
      }
      local_b0._M_string_length = plVar11[1];
      *plVar11 = (long)psVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x199);
      std::operator+(&local_50,&local_b0,&local_70);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (long *)*plVar11;
      plVar13 = plVar11 + 2;
      if (local_90 == plVar13) {
        local_80 = *plVar13;
        lStack_78 = plVar11[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar13;
      }
      local_88 = plVar11[1];
      *plVar11 = (long)plVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_f0 = (long *)*plVar11;
      plVar13 = plVar11 + 2;
      if (local_f0 == plVar13) {
        local_e0 = *plVar13;
        lStack_d8 = plVar11[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar13;
      }
      local_e8 = plVar11[1];
      *plVar11 = (long)plVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::logic_error::logic_error(plVar10,(string *)&local_f0);
      __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    lVar14 = *(long *)((long)this + 0x48U + 0x10);
    if (lVar14 == 0) {
      return;
    }
    lVar15 = *(long *)((long)this + 0x48U + 8);
    lVar16 = 0;
    do {
      this_00 = Symbol::getDeclaredType(*(Symbol **)(lVar15 + lVar16));
      if (this_00 == (DeclaredType *)0x0) {
        assert::assertFailed
                  ("dt",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/expressions/MiscExpressions.h"
                   ,0xe4,
                   "void slang::ast::AssertionInstanceExpression::visitExprs(TVisitor &&) const [TVisitor = (anonymous namespace)::HierarchicalVisitor &]"
                  );
      }
      pEVar8 = DeclaredType::getInitializer(this_00);
      if (pEVar8 != (Expression *)0x0) {
        visit<(anonymous_namespace)::HierarchicalVisitor&>(pEVar8,visitor);
      }
      lVar16 = lVar16 + 8;
    } while (lVar14 << 3 != lVar16);
    return;
  default:
    plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,"");
    plVar11 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar11;
    psVar12 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar12) {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0.field_2._8_8_ = plVar11[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar12;
    }
    local_b0._M_string_length = plVar11[1];
    *plVar11 = (long)psVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x15b);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar11;
    plVar13 = plVar11 + 2;
    if (local_90 == plVar13) {
      local_80 = *plVar13;
      lStack_78 = plVar11[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar13;
    }
    local_88 = plVar11[1];
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar11;
    plVar13 = plVar11 + 2;
    if (local_f0 == plVar13) {
      local_e0 = *plVar13;
      lStack_d8 = plVar11[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar13;
    }
    local_e8 = plVar11[1];
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::logic_error::logic_error(plVar10,(string *)&local_f0);
    __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
switchD_00261afc_caseD_a:
  this = *(Expression **)((long)&(((Type *)this)->super_Symbol).kind + lVar14);
  goto LAB_00261ae2;
switchD_00261afc_caseD_22:
  this = (Expression *)(((Expression *)((long)&((Type *)this)->super_Symbol + 0x30))->type).ptr;
  if ((Type *)this == (Type *)0x0) {
switchD_00261afc_caseD_0:
    return;
  }
  goto LAB_00261ae2;
switchD_00261afc_caseD_b:
  visitor_00 = visitor;
  visit<(anonymous_namespace)::HierarchicalVisitor&>
            ((Expression *)(((Expression *)((long)&((Type *)this)->super_Symbol + 0x30))->type).ptr,
             visitor);
  lVar14 = 0x40;
  goto switchD_00261afc_caseD_a;
}

Assistant:

decltype(auto) Expression::visit(TVisitor&& visitor, Args&&... args) const {
    return visitExpression(this, visitor, std::forward<Args>(args)...);
}